

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

BreakpointProbe * __thiscall
JsrtDebugManager::SetBreakpointHelper_TTD
          (JsrtDebugManager *this,int64 desiredBpId,ScriptContext *scriptContext,
          Utf8SourceInfo *utf8SourceInfo,UINT lineNumber,UINT columnNumber,BOOL *isNewBP)

{
  StatementLocation statement_00;
  StatementLocation statement_01;
  HRESULT HVar1;
  uint32 uVar2;
  charcount_t cVar3;
  BOOL BVar4;
  DebugDocument *this_00;
  LineOffsetCache *this_01;
  BreakpointProbe *pBVar5;
  JsrtDebugDocumentManager *this_02;
  undefined1 auStack_58 [8];
  StatementLocation statement;
  charcount_t byteOffset;
  
  *isNewBP = 0;
  this_00 = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if ((this_00 != (DebugDocument *)0x0) &&
     (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(utf8SourceInfo), -1 < HVar1)) {
    this_01 = Js::Utf8SourceInfo::GetLineOffsetCache(utf8SourceInfo);
    uVar2 = Js::LineOffsetCache::GetLineCount(this_01);
    if (lineNumber < uVar2) {
      statement.bytecodeSpan.end = 0;
      cVar3 = Js::LineOffsetCache::GetCharacterOffsetForLine
                        ((utf8SourceInfo->m_lineOffsetCache).ptr,lineNumber,
                         (charcount_t *)&statement.bytecodeSpan.end);
      statement.function = (FunctionBody *)0x0;
      statement.statement.begin = 0;
      statement.statement.end = 0;
      BVar4 = Js::DebugDocument::GetStatementLocation
                        (this_00,columnNumber + cVar3 + 1,(StatementLocation *)auStack_58);
      if (BVar4 != 0) {
        statement_00.statement = (Interval)statement.function;
        statement_00.function = (FunctionBody *)auStack_58;
        statement_00.bytecodeSpan = statement.statement;
        pBVar5 = Js::DebugDocument::FindBreakpoint(this_00,statement_00);
        if (desiredBpId != -1 && pBVar5 != (BreakpointProbe *)0x0) {
          TTDAbort_unrecoverable_error
                    ("We shouldn\'t be resetting this BP unless it was cleared earlier!");
        }
        if (pBVar5 != (BreakpointProbe *)0x0) {
          return pBVar5;
        }
        statement_01.statement = (Interval)statement.function;
        statement_01.function = (FunctionBody *)auStack_58;
        statement_01.bytecodeSpan = statement.statement;
        pBVar5 = Js::DebugDocument::SetBreakPoint_TTDWbpId(this_00,desiredBpId,statement_01);
        *isNewBP = 1;
        this_02 = GetDebugDocumentManager(this);
        JsrtDebugDocumentManager::AddDocument(this_02,pBVar5->breakpointId,this_00);
        return pBVar5;
      }
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

Js::BreakpointProbe* JsrtDebugManager::SetBreakpointHelper_TTD(int64 desiredBpId, Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber, BOOL* isNewBP)
{
    *isNewBP = FALSE;
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if(debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if(!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        TTDAssert(probe == nullptr || desiredBpId == -1, "We shouldn't be resetting this BP unless it was cleared earlier!");

        if(probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint_TTDWbpId(desiredBpId, statement);
            *isNewBP = TRUE;

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        return probe;
    }

    return nullptr;
}